

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int do_chown(int nargs,char **args)

{
  uint uVar1;
  int iVar2;
  uint __group;
  int *piVar3;
  long in_RSI;
  int in_EDI;
  char *in_stack_ffffffffffffffd8;
  char *pcVar4;
  
  if (in_EDI == 3) {
    pcVar4 = *(char **)(in_RSI + 0x10);
    uVar1 = decode_uid(in_stack_ffffffffffffffd8);
    iVar2 = chown(pcVar4,uVar1,0xffffffff);
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      return -*piVar3;
    }
  }
  else {
    if (in_EDI != 4) {
      return -1;
    }
    pcVar4 = *(char **)(in_RSI + 0x18);
    uVar1 = decode_uid(pcVar4);
    __group = decode_uid(pcVar4);
    iVar2 = chown(pcVar4,uVar1,__group);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      return -*piVar3;
    }
  }
  return 0;
}

Assistant:

int do_chown(int nargs, char **args) {
    /* GID is optional. */
    if (nargs == 3) {
        if (chown(args[2], decode_uid(args[1]), -1) < 0)
            return -errno;
    } else if (nargs == 4) {
        if (chown(args[3], decode_uid(args[1]), decode_uid(args[2])))
            return -errno;
    } else {
        return -1;
    }
    return 0;
}